

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O0

uint64_t mask_most_signif_bytes(uint_fast8_t n)

{
  uint i;
  uint64_t x;
  uint_fast8_t n_local;
  
  x = 0;
  for (i = 0; i < n; i = i + 1) {
    x = 0xffL << (0x38U - (char)(i << 3) & 0x3f) | x;
  }
  return x;
}

Assistant:

uint64_t
mask_most_signif_bytes(uint_fast8_t n)
{
    uint64_t x = 0;
    // Unsigned int should be the fastest unsigned on the machine.
    // Using it to avoid warnings about <<-operator with signed value.
    for (unsigned int i = 0; i < n; i++)
    {
        x |= 0xFFULL << (56U - 8U * i);
    }
    return x;
}